

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

CURLcode hsts_create(hsts *h,char *hostname,_Bool subdomains,curl_off_t expires)

{
  stsentry *ne;
  char *pcVar1;
  stsentry *sts;
  char *duphost;
  size_t hlen;
  curl_off_t expires_local;
  _Bool subdomains_local;
  char *hostname_local;
  hsts *h_local;
  
  duphost = (char *)strlen(hostname);
  if ((duphost != (char *)0x0) && (hostname[(long)(duphost + -1)] == '.')) {
    duphost = duphost + -1;
  }
  if (duphost != (char *)0x0) {
    ne = hsts_entry();
    if (ne == (stsentry *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar1 = (char *)Curl_memdup0(hostname,(size_t)duphost);
    if (pcVar1 == (char *)0x0) {
      (*Curl_cfree)(ne);
      return CURLE_OUT_OF_MEMORY;
    }
    ne->host = pcVar1;
    ne->expires = expires;
    ne->includeSubDomains = subdomains;
    Curl_llist_insert_next(&h->list,(h->list).tail,ne,&ne->node);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode hsts_create(struct hsts *h,
                            const char *hostname,
                            bool subdomains,
                            curl_off_t expires)
{
  size_t hlen;
  DEBUGASSERT(h);
  DEBUGASSERT(hostname);

  hlen = strlen(hostname);
  if(hlen && (hostname[hlen - 1] == '.'))
    /* strip off any trailing dot */
    --hlen;
  if(hlen) {
    char *duphost;
    struct stsentry *sts = hsts_entry();
    if(!sts)
      return CURLE_OUT_OF_MEMORY;

    duphost = Curl_memdup0(hostname, hlen);
    if(!duphost) {
      free(sts);
      return CURLE_OUT_OF_MEMORY;
    }

    sts->host = duphost;
    sts->expires = expires;
    sts->includeSubDomains = subdomains;
    Curl_llist_insert_next(&h->list, h->list.tail, sts, &sts->node);
  }
  return CURLE_OK;
}